

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitClass(ParseNodeClass *pnodeClass,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  undefined1 *puVar1;
  OpCode OVar2;
  ParseNode *this;
  Symbol *pSVar3;
  code *pcVar4;
  bool bVar5;
  RegSlot R1;
  RegSlot RVar6;
  RegSlot RVar7;
  RegSlot R0;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  ByteCodeLabel labelID_01;
  uint cacheId;
  RegSlot RVar8;
  undefined4 *puVar9;
  ParseNodeBin *pPVar10;
  ParseNodeFnc *pPVar11;
  FuncInfo *extraout_RDX;
  FuncInfo *extraout_RDX_00;
  FuncInfo *extraout_RDX_01;
  FuncInfo *extraout_RDX_02;
  FuncInfo *pFVar12;
  ByteCodeWriter *this_00;
  ParseNodePtr this_01;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  
  FuncInfo::AcquireLoc(funcInfo,&pnodeClass->super_ParseNode);
  pPVar11 = pnodeClass->pnodeConstructor;
  if (pPVar11 == (ParseNodeFnc *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2a7a,"(pnodeClass->pnodeConstructor)","pnodeClass->pnodeConstructor");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
    pPVar11 = pnodeClass->pnodeConstructor;
  }
  (pPVar11->super_ParseNode).location = (pnodeClass->super_ParseNode).location;
  R1 = FuncInfo::AcquireTmpRegister(funcInfo);
  BeginEmitBlock(pnodeClass->pnodeBlock,byteCodeGenerator,funcInfo);
  RVar6 = funcInfo->frameDisplayRegister;
  if (RVar6 == 0xffffffff) {
    RVar6 = FuncInfo::GetEnvRegister(funcInfo);
  }
  RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
  RVar6 = ByteCodeGenerator::PrependLocalScopes(byteCodeGenerator,RVar6,RVar7,funcInfo);
  if (RVar6 != RVar7) {
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar7);
  }
  if (pnodeClass->pnodeExtends == (ParseNode *)0x0) {
    if ((RVar6 == funcInfo->frameDisplayRegister) ||
       (RVar7 = FuncInfo::GetEnvRegister(funcInfo), RVar6 == RVar7)) {
      Js::ByteCodeWriter::Reg2U
                (&byteCodeGenerator->m_writer,InitBaseClass,(pnodeClass->super_ParseNode).location,
                 R1,pnodeClass->pnodeConstructor->nestedIndex);
    }
    else {
      Js::ByteCodeWriter::Reg3U
                (&byteCodeGenerator->m_writer,InitInnerBaseClass,
                 (pnodeClass->super_ParseNode).location,R1,RVar6,
                 pnodeClass->pnodeConstructor->nestedIndex);
    }
  }
  else {
    Emit(pnodeClass->pnodeExtends,byteCodeGenerator,funcInfo,0,false,false);
    ByteCodeGenerator::StartStatement(byteCodeGenerator,pnodeClass->pnodeExtends);
    bVar5 = FuncInfo::IsTmpReg(funcInfo,pnodeClass->pnodeExtends->location);
    if (bVar5) {
      RVar7 = pnodeClass->pnodeExtends->location;
    }
    else {
      RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    R0 = FuncInfo::AcquireTmpRegister(funcInfo);
    RVar8 = pnodeClass->pnodeExtends->location;
    if (RVar8 != RVar7) {
      Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A_ReuseLoc,RVar7,RVar8);
    }
    this_00 = &byteCodeGenerator->m_writer;
    labelID = Js::ByteCodeWriter::DefineLabel(this_00);
    labelID_00 = Js::ByteCodeWriter::DefineLabel(this_00);
    labelID_01 = Js::ByteCodeWriter::DefineLabel(this_00);
    Js::ByteCodeWriter::BrReg1(this_00,BrOnNotNullObj_A,labelID,RVar7);
    Js::ByteCodeWriter::Reg1(this_00,LdC_A_Null,R0);
    Js::ByteCodeWriter::Reg1(this_00,LdBaseFncProto,RVar7);
    Js::ByteCodeWriter::Br(this_00,labelID_01);
    Js::ByteCodeWriter::MarkLabel(this_00,labelID);
    Js::ByteCodeWriter::BrReg1(this_00,BrOnConstructor_A,labelID_00,RVar7);
    Js::ByteCodeWriter::W1(this_00,RuntimeTypeError,0x140b);
    Js::ByteCodeWriter::MarkLabel(this_00,labelID_00);
    cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,0x124,false,false);
    Js::ByteCodeWriter::PatchableProperty(this_00,LdFld_ReuseLoc,R0,RVar7,cacheId,false,true);
    Js::ByteCodeWriter::BrReg1(this_00,BrOnObjectOrNull_A,labelID_01,R0);
    Js::ByteCodeWriter::W1(this_00,RuntimeTypeError,0x139f);
    Js::ByteCodeWriter::MarkLabel(this_00,labelID_01);
    if ((RVar6 == funcInfo->frameDisplayRegister) ||
       (RVar8 = FuncInfo::GetEnvRegister(funcInfo), RVar6 == RVar8)) {
      in_stack_ffffffffffffff88 = pnodeClass->pnodeConstructor->nestedIndex;
      Js::ByteCodeWriter::Reg4U
                (this_00,InitClass,(pnodeClass->super_ParseNode).location,R1,RVar7,R0,
                 in_stack_ffffffffffffff88);
    }
    else {
      in_stack_ffffffffffffff88 = RVar6;
      Js::ByteCodeWriter::Reg5U
                (this_00,InitInnerClass,(pnodeClass->super_ParseNode).location,R1,RVar7,R0,RVar6,
                 pnodeClass->pnodeConstructor->nestedIndex);
    }
    FuncInfo::ReleaseTmpRegister(funcInfo,R0);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar7);
    Js::ByteCodeWriter::EndStatement(this_00,pnodeClass->pnodeExtends);
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar6);
  this_01 = pnodeClass->pnodeMembers;
  if (this_01 != (ParseNodePtr)0x0) {
    while (OVar2 = this_01->nop, pPVar10 = ParseNode::AsParseNodeBin(this_01), OVar2 == knopList) {
      this = pPVar10->pnode1;
      pPVar10 = ParseNode::AsParseNodeBin(this);
      pPVar11 = ParseNode::AsParseNodeFnc(pPVar10->pnode2);
      RVar6 = R1;
      if ((pPVar11->fncFlags & kFunctionIsStaticMember) != kFunctionNone) {
        RVar6 = (pnodeClass->super_ParseNode).location;
      }
      EmitMemberNode(this,RVar6,byteCodeGenerator,funcInfo,&pnodeClass->super_ParseNode,false,
                     (bool *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      pPVar10 = ParseNode::AsParseNodeBin(this_01);
      this_01 = pPVar10->pnode2;
    }
    pPVar11 = ParseNode::AsParseNodeFnc(pPVar10->pnode2);
    RVar6 = R1;
    if ((pPVar11->fncFlags & kFunctionIsStaticMember) != kFunctionNone) {
      RVar6 = (pnodeClass->super_ParseNode).location;
    }
    EmitMemberNode(this_01,RVar6,byteCodeGenerator,funcInfo,&pnodeClass->super_ParseNode,false,
                   (bool *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,R1);
  pFVar12 = extraout_RDX;
  if (pnodeClass->pnodeName != (ParseNodeVar *)0x0) {
    pSVar3 = pnodeClass->pnodeName->sym;
    puVar1 = &pSVar3->field_0x42;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffe;
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,(pnodeClass->super_ParseNode).location,pSVar3,(IdentPtr)0x0,
               funcInfo,false,true,false,false);
    pFVar12 = extraout_RDX_00;
  }
  EndEmitBlock(pnodeClass->pnodeBlock,byteCodeGenerator,pFVar12);
  pFVar12 = extraout_RDX_01;
  if (pnodeClass->pnodeDeclName != (ParseNodeVar *)0x0) {
    pSVar3 = pnodeClass->pnodeDeclName->sym;
    puVar1 = &pSVar3->field_0x42;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffe;
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,(pnodeClass->super_ParseNode).location,pSVar3,(IdentPtr)0x0,
               funcInfo,true,false,false,false);
    pFVar12 = extraout_RDX_02;
  }
  if (pnodeClass->isDefaultModuleExport != true) {
    return;
  }
  ByteCodeGenerator::EmitAssignmentToDefaultModuleExport
            (byteCodeGenerator,&pnodeClass->super_ParseNode,pFVar12);
  return;
}

Assistant:

void EmitClass(ParseNodeClass * pnodeClass, ByteCodeGenerator * byteCodeGenerator, FuncInfo * funcInfo)
{
    funcInfo->AcquireLoc(pnodeClass);

    Assert(pnodeClass->pnodeConstructor);
    pnodeClass->pnodeConstructor->location = pnodeClass->location;
    Js::RegSlot protoLoc = funcInfo->AcquireTmpRegister();
    BeginEmitBlock(pnodeClass->pnodeBlock, byteCodeGenerator, funcInfo);

    Js::RegSlot frameDisplayLoc = funcInfo->frameDisplayRegister != Js::Constants::NoRegister ? funcInfo->frameDisplayRegister : funcInfo->GetEnvRegister();
    Js::RegSlot tmpFrameDisplayLoc = funcInfo->AcquireTmpRegister();
    frameDisplayLoc = byteCodeGenerator->PrependLocalScopes(frameDisplayLoc, tmpFrameDisplayLoc, funcInfo);
    if (frameDisplayLoc != tmpFrameDisplayLoc)
    {
        funcInfo->ReleaseTmpRegister(tmpFrameDisplayLoc);
    }

    // Extends
    if (pnodeClass->pnodeExtends)
    {
        Emit(pnodeClass->pnodeExtends, byteCodeGenerator, funcInfo, false);

        byteCodeGenerator->StartStatement(pnodeClass->pnodeExtends);

        Js::RegSlot ctorParentLoc = funcInfo->IsTmpReg(pnodeClass->pnodeExtends->location) ? pnodeClass->pnodeExtends->location : funcInfo->AcquireTmpRegister();
        Js::RegSlot protoParentLoc = funcInfo->AcquireTmpRegister();

        if (pnodeClass->pnodeExtends->location != ctorParentLoc)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, ctorParentLoc, pnodeClass->pnodeExtends->location);
        }

        Js::ByteCodeLabel needProto = byteCodeGenerator->Writer()->DefineLabel();
        Js::ByteCodeLabel haveConstructor = byteCodeGenerator->Writer()->DefineLabel();
        Js::ByteCodeLabel labelParentsFound = byteCodeGenerator->Writer()->DefineLabel();

        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnNotNullObj_A, needProto, ctorParentLoc);

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdC_A_Null, protoParentLoc);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdBaseFncProto, ctorParentLoc);
        byteCodeGenerator->Writer()->Br(labelParentsFound);

        byteCodeGenerator->Writer()->MarkLabel(needProto);
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnConstructor_A, haveConstructor, ctorParentLoc);
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ErrorOnNew));

        byteCodeGenerator->Writer()->MarkLabel(haveConstructor);
        uint cacheId = funcInfo->FindOrAddInlineCacheId(ctorParentLoc, Js::PropertyIds::prototype, false, false);
        byteCodeGenerator->Writer()->PatchableProperty(Js::OpCode::LdFld_ReuseLoc, protoParentLoc, ctorParentLoc, cacheId);
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnObjectOrNull_A, labelParentsFound, protoParentLoc);
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_InvalidPrototype));

        byteCodeGenerator->Writer()->MarkLabel(labelParentsFound);
        if (frameDisplayLoc == funcInfo->frameDisplayRegister || frameDisplayLoc  == funcInfo->GetEnvRegister())
        {
            byteCodeGenerator->Writer()->Reg4U(Js::OpCode::InitClass, pnodeClass->location, protoLoc, ctorParentLoc, protoParentLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
        else
        {
            byteCodeGenerator->Writer()->Reg5U(Js::OpCode::InitInnerClass, pnodeClass->location, protoLoc, ctorParentLoc, protoParentLoc, frameDisplayLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }

        funcInfo->ReleaseTmpRegister(protoParentLoc);
        funcInfo->ReleaseTmpRegister(ctorParentLoc);

        byteCodeGenerator->EndStatement(pnodeClass->pnodeExtends);
    }
    else
    {
        if (frameDisplayLoc == funcInfo->frameDisplayRegister || frameDisplayLoc  == funcInfo->GetEnvRegister())
        {
            byteCodeGenerator->Writer()->Reg2U(Js::OpCode::InitBaseClass, pnodeClass->location, protoLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
        else
        {
            byteCodeGenerator->Writer()->Reg3U(Js::OpCode::InitInnerBaseClass, pnodeClass->location, protoLoc, frameDisplayLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
    }

    funcInfo->ReleaseTmpRegister(frameDisplayLoc);

    // Methods
    bool isObjectEmpty = true;
    ParseNode * pnodeMembers = pnodeClass->pnodeMembers;
    ParseNode * pnodeMember;
    ParseNodeFnc * pnodeMemberFnc;
    if (pnodeMembers != nullptr)
    {
        while (pnodeMembers->nop == knopList)
        {
            pnodeMember = pnodeMembers->AsParseNodeBin()->pnode1;
            pnodeMemberFnc = pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc();
            EmitMemberNode(pnodeMember, pnodeMemberFnc->IsStaticMember() ? pnodeClass->location : protoLoc, byteCodeGenerator, funcInfo, pnodeClass, /*useStore*/ false, &isObjectEmpty);
            pnodeMembers = pnodeMembers->AsParseNodeBin()->pnode2;
        }
        pnodeMemberFnc = pnodeMembers->AsParseNodeBin()->pnode2->AsParseNodeFnc();
        EmitMemberNode(pnodeMembers, pnodeMemberFnc->IsStaticMember() ? pnodeClass->location : protoLoc, byteCodeGenerator, funcInfo, pnodeClass, /*useStore*/ false, &isObjectEmpty);
    }

    funcInfo->ReleaseTmpRegister(protoLoc);

    // Emit name binding.
    if (pnodeClass->pnodeName)
    {
        Symbol * sym = pnodeClass->pnodeName->sym;
        sym->SetNeedDeclaration(false);
        byteCodeGenerator->EmitPropStore(pnodeClass->location, sym, nullptr, funcInfo, false, true);
    }

    EndEmitBlock(pnodeClass->pnodeBlock, byteCodeGenerator, funcInfo);

    if (pnodeClass->pnodeDeclName)
    {
        Symbol * sym = pnodeClass->pnodeDeclName->sym;
        sym->SetNeedDeclaration(false);
        byteCodeGenerator->EmitPropStore(pnodeClass->location, sym, nullptr, funcInfo, true, false);
    }

    if (pnodeClass->IsDefaultModuleExport())
    {
        byteCodeGenerator->EmitAssignmentToDefaultModuleExport(pnodeClass, funcInfo);
    }
}